

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Object * __thiscall xt::VSeq::first(Object *__return_storage_ptr__,VSeq *this)

{
  shared_ptr<xt::_Vector> local_28;
  VSeq *local_18;
  VSeq *this_local;
  
  local_18 = this;
  this_local = (VSeq *)__return_storage_ptr__;
  std::shared_ptr<xt::_Vector>::shared_ptr(&local_28,&this->v);
  vector::nth(__return_storage_ptr__,&local_28,this->index);
  std::shared_ptr<xt::_Vector>::~shared_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Object VSeq::first() const { return vector::nth(v, index); }